

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

alias_tensor_const_instance * __thiscall
dlib::alias_tensor::operator()(alias_tensor *this,tensor *t,size_t offset)

{
  alias_tensor_instance *in_RDI;
  alias_tensor_const_instance *temp;
  size_t in_stack_000001e8;
  tensor *in_stack_000001f0;
  alias_tensor *in_stack_000001f8;
  alias_tensor_instance *this_00;
  
  this_00 = in_RDI;
  alias_tensor_const_instance::alias_tensor_const_instance((alias_tensor_const_instance *)0x27e4f7);
  operator()(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  alias_tensor_instance::operator=(this_00,in_RDI);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x27e52d);
  return (alias_tensor_const_instance *)this_00;
}

Assistant:

alias_tensor_const_instance operator() (
            const tensor& t,
            size_t offset = 0
        ) const
        {
            alias_tensor_const_instance temp;
            temp.inst = (*this)(const_cast<tensor&>(t),offset);
            return temp;
        }